

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

ArrayType * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::ArrayType,(anonymous_namespace)::Node*&,StringView&>
          (Db *this,Node **args,StringView *args_1)

{
  Node *pNVar1;
  ArrayType *pAVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  pAVar2 = (ArrayType *)
           anon_unknown.dwarf_42055d::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  pNVar1 = *args;
  pcVar3 = args_1->First;
  pcVar4 = args_1->Last;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x1;
    bVar5 = pcVar3 != (char *)0x0;
    pcVar3 = (char *)0x1;
    if (bVar5) {
      __assert_fail("FirstChar == SecondChar",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                    ,0x21f,"(anonymous namespace)::NodeOrString::NodeOrString(StringView)");
    }
  }
  (pAVar2->super_Node).K = KArrayType;
  (pAVar2->super_Node).RHSComponentCache = Yes;
  (pAVar2->super_Node).ArrayCache = Yes;
  (pAVar2->super_Node).FunctionCache = No;
  (pAVar2->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ebaf8;
  pAVar2->Base = pNVar1;
  (pAVar2->Dimension).First = pcVar3;
  (pAVar2->Dimension).Second = pcVar4;
  return pAVar2;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }